

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O1

float Tim_ManGetCoRequired(Tim_Man_t *p,int iCo)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Tim_Obj_t *pTVar5;
  Tim_Obj_t *pTVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  float *pfVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  
  if (p->nCos <= iCo) {
    __assert_fail("i < p->nCos",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timInt.h"
                  ,0x5e,"Tim_Obj_t *Tim_ManCo(Tim_Man_t *, int)");
  }
  pTVar5 = p->pCos;
  iVar1 = p->fUseTravId;
  if ((iVar1 == 0) || (pTVar5[iCo].TravId != p->nTravIds)) {
    uVar2 = p->nTravIds;
    pTVar5[iCo].TravId = uVar2;
    iVar3 = pTVar5[iCo].iObj2Box;
    if ((long)iVar3 < 0) {
      puVar12 = (uint *)0x0;
    }
    else {
      if (p->vBoxes->nSize <= iVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar12 = (uint *)p->vBoxes->pArray[iVar3];
    }
    if (puVar12 != (uint *)0x0) {
      puVar12[1] = uVar2;
      if ((iVar1 != 0) && (0 < (int)puVar12[3])) {
        uVar14 = 0;
        do {
          if (p->pCis == (Tim_Obj_t *)0x0) break;
          if (p->pCis[(int)puVar12[(long)(int)puVar12[2] + uVar14 + 7]].TravId != p->nTravIds) {
            printf("Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n"
                   ,uVar14 & 0xffffffff,(ulong)*puVar12);
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < (int)puVar12[3]);
      }
      pfVar7 = Tim_ManBoxDelayTable(p,*puVar12);
      uVar14 = (ulong)puVar12[2];
      if ((0 < (int)puVar12[2]) && (pTVar6 = p->pCos, pTVar6 != (Tim_Obj_t *)0x0)) {
        uVar2 = puVar12[3];
        iVar1 = p->nTravIds;
        uVar10 = 0;
        pfVar13 = pfVar7 + 3;
        do {
          fVar15 = 1e+09;
          if (0 < (int)uVar2) {
            uVar11 = 0;
            fVar15 = 1e+09;
            pfVar8 = pfVar7 + 3;
            pfVar9 = pfVar13;
            do {
              if (p->pCis == (Tim_Obj_t *)0x0) {
                fVar15 = 1e+09;
                break;
              }
              if (((*pfVar8 != -1e+09) || (NAN(*pfVar8))) &&
                 (fVar16 = p->pCis[(int)puVar12[uVar14 + uVar11 + 7]].timeReq - *pfVar9,
                 fVar16 <= fVar15)) {
                fVar15 = fVar16;
              }
              uVar11 = uVar11 + 1;
              pfVar8 = pfVar8 + uVar14 + 1;
              pfVar9 = pfVar9 + uVar14;
            } while (uVar2 != uVar11);
          }
          uVar4 = puVar12[uVar10 + 7];
          pTVar6[(int)uVar4].timeReq = fVar15;
          pTVar6[(int)uVar4].TravId = iVar1;
          uVar10 = uVar10 + 1;
          pfVar13 = pfVar13 + 1;
        } while (uVar10 != uVar14);
      }
    }
  }
  return pTVar5[iCo].timeReq;
}

Assistant:

float Tim_ManGetCoRequired( Tim_Man_t * p, int iCo )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PO
    pObjThis = Tim_ManCo( p, iCo );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeReq;
    pObjThis->TravId = p->nTravIds;
    // consider the main PO
    pBox = Tim_ManCoBox( p, iCo );
    if ( pBox == NULL )
        return pObjThis->timeReq;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the required times of the outputs of the box (PIs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachOutput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n", i, pBox->iBox );
    // compute the required times for each input of the box (POs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachInput( p, pBox, pObjRes, i )
    {
        DelayBest = TIM_ETERNITY;
        Tim_ManBoxForEachOutput( p, pBox, pObj, k )
        {
            pDelays = pTable + 3 + k * pBox->nInputs;
			if ( pDelays[k] != -ABC_INFINITY )
				DelayBest = Abc_MinFloat( DelayBest, pObj->timeReq - pDelays[i] );
        }
        pObjRes->timeReq = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeReq;
}